

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::filter_coarsen_dirs(Omega_h *this,Read<signed_char> *codes,Read<signed_char> *keep_dirs)

{
  int *piVar1;
  Alloc *pAVar2;
  Int dir;
  long lVar3;
  int iVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  long lVar6;
  byte bVar7;
  LO size_in;
  Read<signed_char> RVar8;
  Write<signed_char> codes_w;
  type f;
  Write<signed_char> local_e8;
  Write<signed_char> local_d8;
  string local_c8;
  Alloc *local_a8;
  void *local_a0;
  Alloc *local_98;
  void *local_90;
  Alloc *local_88;
  void *local_80;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  void *pvStack_60;
  Alloc *local_58;
  void *pvStack_50;
  Alloc *local_48;
  void *pvStack_40;
  
  pAVar2 = (codes->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    size_in = (LO)pAVar2->size;
  }
  else {
    size_in = (LO)((ulong)pAVar2 >> 3);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  Write<signed_char>::Write(&local_e8,size_in,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  local_98 = (codes->write_).shared_alloc_.alloc;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_98->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_90 = (codes->write_).shared_alloc_.direct_ptr;
  local_88 = (keep_dirs->write_).shared_alloc_.alloc;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  local_80 = (keep_dirs->write_).shared_alloc_.direct_ptr;
  local_78 = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70 = local_e8.shared_alloc_.direct_ptr;
  if (((ulong)local_e8.shared_alloc_.alloc & 1) == 0) {
    iVar4 = (int)(local_e8.shared_alloc_.alloc)->size;
  }
  else {
    iVar4 = (int)((ulong)local_e8.shared_alloc_.alloc >> 3);
  }
  local_68 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_98->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_58 = local_88;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)(local_88->size * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  local_48 = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  pvStack_40 = local_e8.shared_alloc_.direct_ptr;
  pvStack_60 = local_90;
  pvStack_50 = local_80;
  if (0 < iVar4) {
    local_c8._M_dataplus._M_p = (pointer)local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_68->use_count = local_68->use_count + -1;
      local_c8._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_68->size)->_M_allocated_capacity * 8 + 1);
    }
    local_68 = (Alloc *)0x0;
    pvStack_60 = (void *)0x0;
    local_c8.field_2._M_allocated_capacity = (size_type)local_58;
    if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
      local_58->use_count = local_58->use_count + -1;
      local_c8.field_2._M_allocated_capacity = local_58->size * 8 + 1;
    }
    local_58 = (Alloc *)0x0;
    pvStack_50 = (void *)0x0;
    local_a8 = local_48;
    local_a0 = local_e8.shared_alloc_.direct_ptr;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      local_48->use_count = local_48->use_count + -1;
      local_a8 = (Alloc *)(local_48->size * 8 + 1);
    }
    local_48 = (Alloc *)0x0;
    pvStack_40 = (void *)0x0;
    entering_parallel = '\0';
    lVar6 = 0;
    pvVar5 = local_80;
    do {
      bVar7 = *(byte *)((long)local_90 + lVar6);
      lVar3 = 0;
      do {
        bVar7 = bVar7 & (-(*(char *)((long)pvVar5 + lVar3) != '\0') |
                        ~(byte)(1 << ((byte)lVar3 & 0x1f)));
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      *(byte *)((long)local_e8.shared_alloc_.direct_ptr + lVar6) = bVar7;
      lVar6 = lVar6 + 1;
      pvVar5 = (void *)((long)pvVar5 + 2);
    } while ((int)lVar6 != iVar4);
    local_c8._M_string_length = (size_type)local_90;
    local_c8.field_2._8_8_ = local_80;
    filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_c8);
  }
  filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_68);
  local_d8.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
  local_d8.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
  if ((((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
       local_e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + -1;
    local_d8.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_e8.shared_alloc_.alloc = (Alloc *)0x0;
  local_e8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d8);
  pAVar2 = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  filter_coarsen_dirs(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_98);
  pAVar2 = local_e8.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  RVar8.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar8.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_dirs(Read<I8> codes, Read<I8> keep_dirs) {
  auto codes_w = Write<I8>(codes.size());
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = codes[cand];
    for (Int dir = 0; dir < 2; ++dir) {
      if (!keep_dirs[cand * 2 + dir]) {
        code = dont_collapse(code, dir);
      }
    }
    codes_w[cand] = code;
  };
  parallel_for(codes_w.size(), f, "filter_coarsen_dirs");
  return codes_w;
}